

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void do_laying_hands(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  CClass *this;
  CHAR_DATA *ch_00;
  char *txt;
  long lVar4;
  AFFECT_DATA af;
  char arg [4608];
  
  iVar3 = get_skill(ch,(int)gsn_laying_hands);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar4 = (long)gsn_laying_hands;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar3 = CClass::GetIndex(this);
    if (*(short *)(lVar4 * 0x60 + 0x44e788 + (long)iVar3 * 2) <= sVar1) {
      one_argument(argument,arg);
      if (arg[0] == '\0') {
        txt = "Give your divine touch to whom?\n\r";
      }
      else {
        ch_00 = get_char_room(ch,arg);
        if (ch_00 == (CHAR_DATA *)0x0) {
          txt = "They aren\'t here.\n\r";
        }
        else if (ch_00 == ch) {
          txt = "You can\'t lay hands on yourself.\n\r";
        }
        else {
          bVar2 = is_affected(ch,(int)gsn_laying_hands);
          if (bVar2) {
            txt = "You may only grant divine healing once per day.\n\r";
          }
          else if (ch->mana < 0x23) {
            txt = "You don\'t have the mana.\n\r";
          }
          else {
            lVar4 = (long)gsn_laying_hands;
            ch->mana = ch->mana - skill_table[lVar4].min_mana;
            WAIT_STATE(ch,(int)skill_table[lVar4].beats);
            init_affect(&af);
            af.where = 0;
            af.aftype = 7;
            af.type = gsn_laying_hands;
            af.level = ch->level;
            af.duration = 0x30;
            af.location = 0;
            af.modifier = 0;
            affect_to_char(ch,&af);
            iVar3 = dice((int)ch->level,0xc);
            bVar2 = is_evil(ch_00);
            if (bVar2) {
              act("$n lays $s hands upon $N, and $n\'s flesh begins to crackle!",ch,(void *)0x0,
                  ch_00,1);
              act("You lay your hands upon $N... and your flesh begins to crackle!",ch,(void *)0x0,
                  ch_00,3);
              act("$n lays $s hands upon you... and $s flesh begins to crackle!",ch,(void *)0x0,
                  ch_00,2);
              damage_new(ch,ch,iVar3,(int)gsn_laying_hands,10,true,false,0,1,(char *)0x0);
              return;
            }
            iVar3 = iVar3 + ch_00->hit;
            if (ch_00->max_hit <= iVar3) {
              iVar3 = (int)ch_00->max_hit;
            }
            ch_00->hit = iVar3;
            act("$n lays $s hands upon $N and $N\'s wounds seem to heal.",ch,(void *)0x0,ch_00,1);
            act("You lay your hands upon $N and $S wounds seem to heal.",ch,(void *)0x0,ch_00,3);
            act("$n lays $s hands upon you in blessed communication and your wounds heal.",ch,
                (void *)0x0,ch_00,2);
            sVar1 = ch->level;
            iVar3 = dice(1,10);
            bVar2 = check_dispel(sVar1 - iVar3,ch_00,(int)gsn_poison);
            if (bVar2) {
              send_to_char("A warm feeling runs through your body.\n\r",ch_00);
              act("$n looks much better.",ch_00,(void *)0x0,(void *)0x0,0);
            }
            sVar1 = ch->level;
            iVar3 = dice(3,4);
            bVar2 = check_dispel(sVar1 - iVar3,ch_00,(int)gsn_plague);
            if (bVar2) {
              send_to_char("Your plague sores vanish.\n\r",ch_00);
              act("$n looks relieved as $s plague sores vanish.",ch_00,(void *)0x0,(void *)0x0,0);
            }
            sVar1 = ch->level;
            iVar3 = dice(3,5);
            bVar2 = check_dispel(sVar1 - iVar3,ch_00,(int)gsn_blindness);
            if (!bVar2) {
              return;
            }
            txt = "You can see again.\n\r";
            ch = ch_00;
          }
        }
      }
      send_to_char(txt,ch);
      return;
    }
  }
  send_to_char("You do not have the ability to divinely heal.\n\r",ch);
  return;
}

Assistant:

void do_laying_hands(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim; /* Well not really victim, but keeping it standard varibale anmes */
	AFFECT_DATA af;
	int heal;
	int chance;

	if ((get_skill(ch, gsn_laying_hands) == 0) ||
		(ch->level < skill_table[gsn_laying_hands].skill_level[ch->Class()->GetIndex()]))
	{
		send_to_char("You do not have the ability to divinely heal.\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Give your divine touch to whom?\n\r", ch);
		return;
	}

	if ((victim = get_char_room(ch, arg)) == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch == victim)
	{
		send_to_char("You can't lay hands on yourself.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_laying_hands))
	{
		send_to_char("You may only grant divine healing once per day.\n\r", ch);
		return;
	}

	if (ch->mana < 35)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}

	ch->mana -= skill_table[gsn_laying_hands].min_mana;

	WAIT_STATE(ch, skill_table[gsn_laying_hands].beats);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = gsn_laying_hands;
	af.level = ch->level;
	af.duration = 48;
	af.modifier = 0;
	af.location = 0;
	affect_to_char(ch, &af);

	heal = dice(ch->level, 12);

	if (ch == victim)
	{
		send_to_char("You cannot lay hands on yourself.\n\r", ch);
		return;
	}

	if (!is_evil(victim))
	{
		victim->hit = std::min(victim->hit + heal, (int)victim->max_hit);
		act("$n lays $s hands upon $N and $N's wounds seem to heal.", ch, nullptr, victim, TO_NOTVICT);
		act("You lay your hands upon $N and $S wounds seem to heal.", ch, nullptr, victim, TO_CHAR);
		act("$n lays $s hands upon you in blessed communication and your wounds heal.", ch, nullptr, victim, TO_VICT);

		if (check_dispel(ch->level - (dice(1, 10)), victim, gsn_poison))
		{
			send_to_char("A warm feeling runs through your body.\n\r", victim);
			act("$n looks much better.", victim, nullptr, nullptr, TO_ROOM);
		}

		if (check_dispel(ch->level - (dice(3, 4)), victim, gsn_plague))
		{
			send_to_char("Your plague sores vanish.\n\r", victim);
			act("$n looks relieved as $s plague sores vanish.", victim, nullptr, nullptr, TO_ROOM);
		}

		if (check_dispel(ch->level - (dice(3, 5)), victim, gsn_blindness))
		{
			send_to_char("You can see again.\n\r", victim);
		}
	}
	else
	{
		act("$n lays $s hands upon $N, and $n's flesh begins to crackle!", ch, nullptr, victim, TO_NOTVICT);
		act("You lay your hands upon $N... and your flesh begins to crackle!", ch, nullptr, victim, TO_CHAR);
		act("$n lays $s hands upon you... and $s flesh begins to crackle!", ch, nullptr, victim, TO_VICT);

		damage_new(ch, ch, heal, gsn_laying_hands, DAM_HOLY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
	}
}